

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_addmul_v_s256_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint w;
  int iVar5;
  ulong uVar6;
  block_t *Ablock;
  long lVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  
  auVar17 = ZEXT1664(*(undefined1 (*) [16])c->w64);
  auVar19._8_8_ = 0x8080808003020100;
  auVar19._0_8_ = 0x8080808003020100;
  auVar1 = vpmovsxbq_avx(ZEXT216(0x3c3d));
  auVar2 = vpmovsxbq_avx(ZEXT216(0x3a3b));
  auVar3 = vpmovsxbq_avx(ZEXT216(0x3839));
  auVar18 = ZEXT1664((undefined1  [16])0x0);
  iVar5 = 2;
  do {
    uVar6 = v->w64[0];
    lVar7 = 0;
    do {
      uVar8 = (uint)uVar6;
      auVar9 = vpbroadcastq_avx512vl();
      uVar6 = uVar6 >> 8;
      auVar10 = vpbroadcastq_avx512vl();
      auVar4 = vpsllvq_avx2(auVar9,auVar1);
      auVar12 = vpsllvq_avx2(auVar9,auVar2);
      auVar13 = vpshufb_avx(ZEXT416(uVar8 & 1),auVar19);
      auVar10 = vpsraq_avx512vl(auVar10,0x3f);
      auVar11 = vpsraq_avx512vl(auVar4,0x3f);
      auVar12 = vpsraq_avx512vl(auVar12,0x3f);
      auVar4 = vpshufd_avx(auVar10,0xee);
      auVar15 = vpermq_avx2(ZEXT1632(auVar11),0x50);
      auVar16 = vpermq_avx2(ZEXT1632(auVar12),0x50);
      auVar13 = vpsubq_avx((undefined1  [16])0x0,auVar13);
      auVar14 = vpternlogq_avx512vl(auVar18._0_32_,auVar15,
                                    *(undefined1 (*) [32])((long)A[1].w64 + lVar7),0x78);
      auVar15._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar13;
      auVar15._16_16_ = ZEXT116(1) * auVar4;
      auVar15 = vpternlogq_avx512vl(auVar17._0_32_,auVar15,
                                    *(undefined1 (*) [32])((long)A->w64 + lVar7),0x78);
      auVar13 = vpsllvq_avx2(auVar9,auVar3);
      auVar13 = vpsraq_avx512vl(auVar13,0x3f);
      auVar16 = vpternlogq_avx512vl(auVar15,auVar16,*(undefined1 (*) [32])((long)A[2].w64 + lVar7),
                                    0x78);
      auVar17 = ZEXT3264(auVar16);
      auVar15 = vpermq_avx2(ZEXT1632(auVar13),0x50);
      auVar15 = vpternlogq_avx512vl(auVar14,auVar15,*(undefined1 (*) [32])((long)A[3].w64 + lVar7),
                                    0x78);
      auVar18 = ZEXT3264(auVar15);
      lVar7 = lVar7 + 0x80;
    } while ((int)lVar7 != 0x400);
    A = A + 0x20;
    v = (mzd_local_t *)((long)v + 8);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  *(undefined1 (*) [16])c->w64 = SUB3216(auVar16 ^ auVar15,0x10) ^ SUB3216(auVar16 ^ auVar15,0);
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_addmul_v_s256_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[2] = {_mm256_setr_m128i(mm128_load(cblock->w64), mm128_zero), mm256_zero};
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 8, idx >>= 8, Ablock += 4) {
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask_2(idx, 2));
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask_2(idx, 4));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask_2(idx, 6));
    }
  }
  cval[0] = mm256_xor(cval[0], cval[1]);
  mm128_store(
      cblock->w64,
      _mm256_extracti128_si256(
          mm256_xor(cval[0], _mm256_permute4x64_epi64(cval[0], _MM_SHUFFLE(3, 2, 3, 2))), 0));
}